

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Status __thiscall
leveldb::Table::Open
          (Table *this,Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  uint64_t file_00;
  bool bVar1;
  BlockHandle *pBVar2;
  Block *this_00;
  Rep *this_01;
  Table *this_02;
  uint64_t local_138;
  Rep *rep;
  Block *index_block;
  undefined1 local_f0 [8];
  ReadOptions opt;
  BlockContents index_block_contents;
  undefined1 local_c0 [8];
  Footer footer;
  undefined1 local_98 [8];
  Slice footer_input;
  char footer_space [48];
  Slice local_50;
  Slice local_40;
  Table **local_30;
  Table **table_local;
  uint64_t size_local;
  RandomAccessFile *file_local;
  Options *options_local;
  Status *s;
  
  *table = (Table *)0x0;
  local_30 = table;
  table_local = (Table **)size;
  size_local = (uint64_t)file;
  file_local = (RandomAccessFile *)options;
  options_local = (Options *)this;
  if (size < 0x30) {
    Slice::Slice(&local_40,"file is too short to be an sstable");
    Slice::Slice(&local_50);
    Status::Corruption((Status *)this,&local_40,&local_50);
  }
  else {
    Slice::Slice((Slice *)local_98);
    footer.index_handle_.size_._7_1_ = 0;
    (**(code **)(*(long *)size_local + 0x10))
              (this,size_local,table_local + -6,0x30,local_98,&footer_input.size_);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      Footer::Footer((Footer *)local_c0);
      Footer::DecodeFrom((Footer *)&index_block_contents.cachable,(Slice *)local_c0);
      Status::operator=((Status *)this,(Status *)&index_block_contents.cachable);
      Status::~Status((Status *)&index_block_contents.cachable);
      bVar1 = Status::ok((Status *)this);
      if (bVar1) {
        BlockContents::BlockContents((BlockContents *)&opt.snapshot);
        ReadOptions::ReadOptions((ReadOptions *)local_f0);
        file_00 = size_local;
        if (((ulong)file_local[1]._vptr_RandomAccessFile & 0x10000) != 0) {
          local_f0[0] = true;
        }
        pBVar2 = Footer::index_handle((Footer *)local_c0);
        ReadBlock((leveldb *)&index_block,(RandomAccessFile *)file_00,(ReadOptions *)local_f0,pBVar2
                  ,(BlockContents *)&opt.snapshot);
        Status::operator=((Status *)this,(Status *)&index_block);
        Status::~Status((Status *)&index_block);
        bVar1 = Status::ok((Status *)this);
        if (bVar1) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,(BlockContents *)&opt.snapshot);
          this_01 = (Rep *)operator_new(0xa0);
          Rep::Rep(this_01);
          memcpy(this_01,file_local,0x60);
          this_01->file = (RandomAccessFile *)size_local;
          pBVar2 = Footer::metaindex_handle((Footer *)local_c0);
          (this_01->metaindex_handle).offset_ = pBVar2->offset_;
          (this_01->metaindex_handle).size_ = pBVar2->size_;
          this_01->index_block = this_00;
          if (file_local[6]._vptr_RandomAccessFile == (_func_int **)0x0) {
            local_138 = 0;
          }
          else {
            local_138 = (**(code **)(*file_local[6]._vptr_RandomAccessFile + 0x38))();
          }
          this_01->cache_id = local_138;
          this_01->filter_data = (char *)0x0;
          this_01->filter = (FilterBlockReader *)0x0;
          this_02 = (Table *)operator_new(8);
          Table(this_02,this_01);
          *local_30 = this_02;
          ReadMeta(*local_30,(Footer *)local_c0);
        }
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  ReadOptions opt;
  if (options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  s = ReadBlock(file, opt, footer.index_handle(), &index_block_contents);

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}